

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

iterator __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
erase(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this,const_iterator first,const_iterator last)

{
  int start;
  const_iterator cVar1;
  difference_type dVar2;
  iterator it;
  iterator iVar3;
  size_type last_offset;
  size_type pos_offset;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  const_iterator last_local;
  const_iterator first_local;
  
  cVar1 = cbegin(this);
  dVar2 = std::distance<google::protobuf::internal::RepeatedPtrIterator<std::__cxx11::string_const>>
                    ((RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )cVar1.it_,
                     (RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )first.it_);
  start = (int)dVar2;
  cVar1 = cbegin(this);
  dVar2 = std::distance<google::protobuf::internal::RepeatedPtrIterator<std::__cxx11::string_const>>
                    ((RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )cVar1.it_,
                     (RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )last.it_);
  DeleteSubrange(this,start,(int)dVar2 - start);
  it = begin(this);
  iVar3 = internal::operator+(it.it_,(long)start);
  return (iterator)iVar3.it_;
}

Assistant:

inline typename RepeatedPtrField<Element>::iterator
RepeatedPtrField<Element>::erase(const_iterator first, const_iterator last)
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  size_type pos_offset = static_cast<size_type>(std::distance(cbegin(), first));
  size_type last_offset = static_cast<size_type>(std::distance(cbegin(), last));
  DeleteSubrange(pos_offset, last_offset - pos_offset);
  return begin() + pos_offset;
}